

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParam.cpp
# Opt level: O1

void __thiscall
OpenMD::TetrahedralityParam::TetrahedralityParam
          (TetrahedralityParam *this,SimInfo *info,string *filename,string *sele,double rCut,
          int nbins)

{
  SelectionEvaluator *this_00;
  pointer pcVar1;
  long *plVar2;
  pointer pOVar3;
  long lVar4;
  undefined1 local_80 [24];
  long lStack_68;
  string *local_60;
  RealType local_58;
  string local_50;
  
  local_58 = rCut;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__TetrahedralityParam_0033b770;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar1 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript_,pcVar1,pcVar1 + sele->_M_string_length);
  local_60 = &this->selectionScript_;
  SelectionManager::SelectionManager(&this->seleMan_,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  (this->Tetrahedral_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Tetrahedral_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Distorted_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Distorted_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Q_histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->Distorted_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Q_histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->Q_histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->Tetrahedral_).
  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getPrefix(&local_50,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar3 = (pointer)(plVar2 + 2);
  if ((pointer)*plVar2 == pOVar3) {
    local_80._16_8_ =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_68 = plVar2[3];
    local_80._0_8_ = (pointer)(local_80 + 0x10);
  }
  else {
    local_80._16_8_ =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_80._0_8_ = (pointer)*plVar2;
  }
  local_80._8_8_ = plVar2[1];
  *plVar2 = (long)pOVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_80._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_80,this_00);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_80._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_80);
  }
  this->rCut_ = local_58;
  std::vector<int,_std::allocator<int>_>::resize(&this->Q_histogram_,(long)this->nBins_);
  *(undefined4 *)&this->MinQ_ = 0;
  *(undefined4 *)((long)&this->MinQ_ + 4) = 0;
  *(undefined4 *)&this->MaxQ_ = 0x9999999a;
  *(undefined4 *)((long)&this->MaxQ_ + 4) = 0x3ff19999;
  this->deltaQ_ = 1.1 / (double)this->nBins_;
  return;
}

Assistant:

TetrahedralityParam::TetrahedralityParam(SimInfo* info,
                                           const std::string& filename,
                                           const std::string& sele, double rCut,
                                           int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info) {
    setOutputName(getPrefix(filename) + ".q");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // Set up cutoff radius:

    rCut_ = rCut;

    Q_histogram_.resize(nBins_);

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / nBins_;
  }